

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Statement> __thiscall Parser::whileStatement(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  ptr<StatementBlock> statBlock;
  ptr<Expression> condition;
  undefined1 local_49;
  undefined1 local_48 [32];
  _Alloc_hider local_28;
  _Alloc_hider a_Stack_20 [2];
  
  consume(in_RSI);
  expression((Parser *)(local_48 + 0x10));
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)local_48);
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<WhileStatement,std::allocator<WhileStatement>,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_20,(WhileStatement **)&local_28,
             (allocator<WhileStatement> *)&local_49,(shared_ptr<Expression> *)(local_48 + 0x10),
             (shared_ptr<StatementBlock> *)local_48);
  (this->filepath)._M_dataplus._M_p = local_28._M_p;
  (this->filepath)._M_string_length = (size_type)a_Stack_20[0]._M_p;
  _Var1._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_);
    _Var1._M_pi = extraout_RDX_01;
  }
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::whileStatement() {
    consume();
    ptr<Expression> condition = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<WhileStatement>(condition, statBlock);
}